

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O1

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,uint16_t bone0,uint16_t bone1,float weight0)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  float fVar4;
  
  uVar3 = (uint)CONCAT62(in_register_00000032,bone0);
  if (bone0 != bone1) {
    fVar4 = 1.0 - weight0;
    if ((bone0 < bone1) || ((bone0 == bone1 && (fVar4 < weight0)))) {
      uVar1 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
      uVar2 = (ulong)uVar1;
      if (uVar2 < 4) {
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar1 + 1;
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].bone =
             uVar3;
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].weight =
             fVar4;
        uVar3 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
        uVar2 = (ulong)uVar3;
        if (uVar2 < 4) {
          (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar3 + 1;
          (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].bone =
               (uint)bone1;
          (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].weight
               = weight0;
          return;
        }
      }
    }
    else {
      uVar1 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
      uVar2 = (ulong)uVar1;
      if (uVar2 < 4) {
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar1 + 1;
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].bone =
             (uint)bone1;
        (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].weight =
             weight0;
        uVar1 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
        uVar2 = (ulong)uVar1;
        if (uVar2 < 4) {
          (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar1 + 1;
          (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].bone =
               uVar3;
          (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].weight
               = fVar4;
          return;
        }
      }
    }
  }
  else {
    uVar1 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
    uVar2 = (ulong)uVar1;
    if (uVar2 < 4) {
      (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar1 + 1;
      (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].bone =
           uVar3;
      (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar2].weight =
           1.0;
      return;
    }
  }
  __assert_fail("count < N",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_fixed_vector.h"
                ,0x5b,
                "void xray_re::_svector<xray_re::_bone_weight<unsigned int, float>, 4>::push_back(const T &) [T = xray_re::_bone_weight<unsigned int, float>, N = 4]"
               );
}

Assistant:

void _influence<Tb, Tw>::set(uint16_t bone0, uint16_t bone1, float weight0)
{
#if 0
	assert(weight0 >= 0.f && weight0 <= 1.f);
	assert(bone0 < MAX_BONES && bone1 < MAX_BONES);
#endif
	if (bone0 == bone1) {
		push_back(_bone_weight<Tb, Tw>(bone0, Tw(1)));
	} else {
		_bone_weight<Tb, Tw> bw0(bone0, Tw(1.f - weight0));
		_bone_weight<Tb, Tw> bw1(bone1, Tw(weight0));
#if 0
		xr_assert(weight0 != 0);
		xr_assert(1.f != weight0);
		xr_assert(!equivalent<Tw>(weight0, 0));
		xr_assert(!equivalent<Tw>(1.f - weight0, 0));
#endif
		if (bw0 < bw1) {
			push_back(bw0);
			push_back(bw1);
		} else {
			push_back(bw1);
			push_back(bw0);
		}
	}
}